

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall
double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint factor;
  bool bVar10;
  
  uVar6 = (ulong)base;
  this->used_bigits_ = 0;
  this->exponent_ = 0;
  if (power_exponent == 0) {
    this->bigits_buffer_[0] = 1;
    this->used_bigits_ = 1;
    return;
  }
  if ((base & 1) == 0) {
    iVar9 = 0;
    do {
      uVar6 = uVar6 >> 1;
      iVar9 = iVar9 + 1;
      factor = (uint)uVar6;
    } while ((uVar6 & 1) == 0);
  }
  else {
    factor = (uint)base;
    iVar9 = 0;
  }
  uVar8 = 0x1f;
  if (factor != 0) {
    for (; factor >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  iVar3 = (uVar8 ^ 0xffffffe0) + 0x21;
  if (factor == 0) {
    iVar3 = 0;
  }
  if (iVar3 * power_exponent < 0xde4) {
    uVar8 = 1;
    do {
      uVar7 = uVar8;
      uVar8 = uVar7 * 2;
    } while ((int)uVar7 <= power_exponent);
    uVar8 = (int)uVar7 >> 2;
    uVar5 = uVar6;
    if (uVar7 < 4) {
      bVar2 = false;
    }
    else {
      bVar10 = false;
      bVar2 = false;
      uVar7 = uVar8;
      do {
        uVar5 = uVar5 * uVar5;
        if ((uVar7 & power_exponent) != 0) {
          bVar2 = bVar10;
          uVar1 = uVar6;
          if (uVar5 >> (0x40U - (char)iVar3 & 0x3f) != 0) {
            bVar2 = true;
            uVar1 = 1;
          }
          uVar5 = uVar5 * uVar1;
          bVar10 = bVar2;
        }
        uVar8 = (int)uVar7 >> 1;
      } while ((1 < uVar7) && (uVar7 = uVar8, uVar5 >> 0x20 == 0));
    }
    this->used_bigits_ = 0;
    this->exponent_ = 0;
    if (uVar5 != 0) {
      lVar4 = 0;
      do {
        this->bigits_buffer_[lVar4] = (uint)uVar5 & 0xfffffff;
        lVar4 = lVar4 + 1;
        bVar10 = 0xfffffff < uVar5;
        uVar5 = uVar5 >> 0x1c;
      } while (bVar10);
      this->used_bigits_ = (int16_t)lVar4;
    }
    if (bVar2) {
      MultiplyByUInt32(this,factor);
    }
    if (uVar8 != 0) {
      do {
        Square(this);
        if ((uVar8 & power_exponent) != 0) {
          MultiplyByUInt32(this,factor);
        }
        bVar2 = 1 < uVar8;
        uVar8 = (int)uVar8 >> 1;
      } while (bVar2);
    }
    ShiftLeft(this,iVar9 * power_exponent);
    return;
  }
  abort();
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, const int power_exponent) {
  DOUBLE_CONVERSION_ASSERT(base != 0);
  DOUBLE_CONVERSION_ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  const int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multiplication = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      DOUBLE_CONVERSION_ASSERT(bit_size > 0);
      const uint64_t base_bits_mask =
        ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      const bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multiplication = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multiplication) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}